

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

Object * executeBlock(Object *__return_storage_ptr__,Block b,Environment *env)

{
  Statement *pSVar1;
  ulong uVar2;
  
  pSVar1 = b.statements;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
  (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
  __return_storage_ptr__->type = OBJECT_NULL;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
  (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
  if (0 < b.numStatements) {
    uVar2 = (ulong)(b.numStatements & 0x7fffffff);
    do {
      uVar2 = uVar2 - 1;
      executeStatement(__return_storage_ptr__,*pSVar1,env);
      if (brk != '\0') {
        return __return_storage_ptr__;
      }
      if ((ret & 1) != 0) {
        return __return_storage_ptr__;
      }
      pSVar1 = pSVar1 + 1;
    } while (uVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

static Object executeBlock(Block b, Environment *env){
    //debug("Executing block statement");
    int num = 0;
    Object retl = nullObject;
    while(num < b.numStatements){
        retl = executeStatement(b.statements[num], env);
        if(brk || ret)
            break;
        num++;
    }
    return retl;
}